

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpillPointers.cpp
# Opt level: O3

void __thiscall wasm::SpillPointers::spillPointers(SpillPointers *this)

{
  pointer puVar1;
  BasicBlock *pBVar2;
  long *plVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  __node_base _Var6;
  pointer puVar7;
  uint uVar8;
  size_t sVar9;
  Type TVar10;
  mapped_type *pmVar11;
  const_iterator cVar12;
  int *piVar13;
  undefined4 extraout_var;
  mapped_type *pppEVar14;
  __hash_code __code;
  long lVar15;
  ulong uVar16;
  int iVar17;
  pointer puVar18;
  ulong uVar19;
  Type in_R8;
  undefined1 auVar20 [8];
  Function *this_00;
  undefined1 local_f8 [8];
  PointerMap pointerMap;
  uint local_9c;
  Function *pFStack_98;
  uint index;
  pointer local_90;
  undefined1 auStack_88 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> toSpill;
  undefined1 local_68 [8];
  SetOfLocals live;
  Index local_34;
  
  this_00 = (this->
            super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
            ).super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.
            super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
            .super_PostWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.
            super_Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.
            currFunction;
  live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&this->pointerType;
  (this->pointerType).id =
       *(uintptr_t *)
        ((long)(((((this->
                   super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                   ).
                   super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                   .
                   super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
                   .super_PostWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                   .super_Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.
                  currModule)->memories).
                 super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
               super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t + 0x50);
  local_f8 = (undefined1  [8])&pointerMap._M_h._M_rehash_policy._M_next_resize;
  pointerMap._M_h._M_buckets = (__buckets_ptr)0x1;
  pointerMap._M_h._M_bucket_count = 0;
  pointerMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  pointerMap._M_h._M_element_count._0_4_ = 0x3f800000;
  pointerMap._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  pointerMap._M_h._M_rehash_policy._4_4_ = 0;
  pointerMap._M_h._M_rehash_policy._M_next_resize = 0;
  uVar8 = 0;
  while( true ) {
    local_68._0_4_ = uVar8;
    sVar9 = Function::getNumLocals(this_00);
    if (sVar9 <= uVar8) break;
    TVar10 = Function::getLocalType(this_00,local_68._0_4_);
    _Var6 = pointerMap._M_h._M_before_begin;
    if (TVar10.id ==
        *(uintptr_t *)
         live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage) {
      uVar8 = wasm::Type::getByteSize
                        ((Type *)live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
      pmVar11 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)local_f8,(key_type *)local_68);
      *pmVar11 = uVar8 * (int)_Var6._M_nxt;
    }
    uVar8 = local_68._0_4_ + 1;
  }
  puVar18 = (this->
            super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
            ).super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.
            super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
            .basicBlocks.
            super__Vector_base<std::unique_ptr<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = *(pointer *)
            ((long)&(this->
                    super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                    ).
                    super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                    .
                    super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
                    .basicBlocks.
                    super__Vector_base<std::unique_ptr<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
                    ._M_impl.super__Vector_impl_data + 8);
  if (puVar18 != puVar1) {
    pointerMap._M_h._M_single_bucket =
         (__node_base_ptr)
         &(this->
          super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
          ).super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.
          liveBlocks;
    local_34 = 0xffffffff;
    local_90 = (pointer)0x0;
    pFStack_98 = this_00;
    do {
      local_68 = (undefined1  [8])
                 (puVar18->_M_t).
                 super___uniq_ptr_impl<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>
                 .
                 super__Head_base<0UL,_wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_false>
                 ._M_head_impl;
      cVar12 = std::
               _Hashtable<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>,_std::hash<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::find((_Hashtable<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>,_std::hash<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)pointerMap._M_h._M_single_bucket,(key_type *)local_68);
      if (cVar12.
          super__Node_iterator_base<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_false>
          ._M_cur != (__node_type *)0x0) {
        pBVar2 = (puVar18->_M_t).
                 super___uniq_ptr_impl<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>
                 .
                 super__Head_base<0UL,_wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_false>
                 ._M_head_impl;
        piVar13 = *(int **)&(pBVar2->contents).actions.
                            super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>
                            ._M_impl;
        lVar15 = (long)*(pointer *)((long)&(pBVar2->contents).actions + 8) - (long)piVar13;
        if (lVar15 != 0) {
          uVar16 = (lVar15 >> 3) * -0x5555555555555555;
          iVar17 = -1;
          uVar8 = 1;
          do {
            if (*piVar13 == 2) {
              iVar17 = uVar8 - 1;
            }
            uVar19 = (ulong)uVar8;
            piVar13 = piVar13 + 6;
            uVar8 = uVar8 + 1;
          } while (uVar19 <= uVar16 && uVar16 - uVar19 != 0);
          if (iVar17 != -1) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,
                       &(pBVar2->contents).end.
                        super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
            uVar8 = (int)((long)*(pointer *)((long)&(pBVar2->contents).actions + 8) -
                          *(long *)&(pBVar2->contents).actions.
                                    super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>
                                    ._M_impl >> 3) * -0x55555555;
            if (0 < (int)uVar8) {
              uVar16 = (ulong)(uVar8 & 0x7fffffff);
              do {
                puVar7 = live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                piVar13 = (int *)(*(long *)&(pBVar2->contents).actions.
                                            super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>
                                            ._M_impl + (uVar16 - 1) * 0x18);
                iVar17 = *piVar13;
                if (iVar17 == 2) {
                  auStack_88 = (undefined1  [8])0x0;
                  toSpill.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  toSpill.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  this_00 = pFStack_98;
                  auVar20 = local_68;
                  if (local_68 !=
                      (undefined1  [8])
                      live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start) {
                    do {
                      local_9c = *(uint *)&(((BasicBlock *)auVar20)->contents).start.
                                           super_vector<unsigned_int,_std::allocator<unsigned_int>_>
                                           .
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_start;
                      in_R8.id = (uintptr_t)pointerMap._M_h._M_buckets;
                      if (*(long **)((long)local_f8 +
                                    ((ulong)local_9c % (ulong)pointerMap._M_h._M_buckets) * 8) !=
                          (long *)0x0) {
                        plVar3 = (long *)**(long **)((long)local_f8 +
                                                    ((ulong)local_9c %
                                                    (ulong)pointerMap._M_h._M_buckets) * 8);
                        uVar8 = *(uint *)(plVar3 + 1);
                        while (local_9c != uVar8) {
                          plVar3 = (long *)*plVar3;
                          if ((plVar3 == (long *)0x0) ||
                             (uVar8 = *(uint *)(plVar3 + 1),
                             (ulong)uVar8 % (ulong)pointerMap._M_h._M_buckets !=
                             (ulong)local_9c % (ulong)pointerMap._M_h._M_buckets))
                          goto LAB_00b44851;
                        }
                        if (toSpill.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start ==
                            toSpill.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_finish) {
                          std::vector<unsigned_int,std::allocator<unsigned_int>>::
                          _M_realloc_insert<unsigned_int_const&>
                                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)auStack_88
                                     ,(iterator)
                                      toSpill.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start,&local_9c);
                        }
                        else {
                          *toSpill.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start = local_9c;
                          toSpill.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start =
                               toSpill.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + 1;
                        }
                      }
LAB_00b44851:
                      this_00 = pFStack_98;
                      auVar20 = (undefined1  [8])
                                ((long)&(((BasicBlock *)auVar20)->contents).start.
                                        super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 4);
                    } while (auVar20 != (undefined1  [8])puVar7);
                    if (auStack_88 !=
                        (undefined1  [8])
                        toSpill.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start) {
                      if (((ulong)local_90 & 1) == 0) {
                        auVar5._8_8_ = 0;
                        auVar5._0_8_ = *(ulong *)live.
                                                 super_vector<unsigned_int,_std::allocator<unsigned_int>_>
                                                 .
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
                        local_34 = Builder::addVar((Builder *)pFStack_98,(Function *)0x0,
                                                   (Name)(auVar5 << 0x40),in_R8);
                        local_90 = (pointer)CONCAT71((int7)(CONCAT44(extraout_var,local_34) >> 8),1)
                        ;
                      }
                      pppEVar14 = std::__detail::
                                  _Map_base<wasm::Expression_**,_std::pair<wasm::Expression_**const,_wasm::Expression_**>,_std::allocator<std::pair<wasm::Expression_**const,_wasm::Expression_**>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_**>,_std::hash<wasm::Expression_**>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  ::operator[]((_Map_base<wasm::Expression_**,_std::pair<wasm::Expression_**const,_wasm::Expression_**>,_std::allocator<std::pair<wasm::Expression_**const,_wasm::Expression_**>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_**>,_std::hash<wasm::Expression_**>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                                *)&this->actualPointers,(key_type *)(piVar13 + 2));
                      in_R8.id = (uintptr_t)local_f8;
                      spillPointersAroundCall
                                (this,*pppEVar14,
                                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_88,
                                 local_34,(PointerMap *)in_R8.id,this_00,
                                 (this->
                                 super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                                 ).
                                 super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                                 .
                                 super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
                                 .
                                 super_PostWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                                 .
                                 super_Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                                 .currModule);
                    }
                    if (auStack_88 != (undefined1  [8])0x0) {
                      operator_delete((void *)auStack_88,
                                      (long)toSpill.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)auStack_88);
                    }
                  }
                }
                else if (iVar17 == 1) {
                  SortedVector::erase((SortedVector *)local_68,piVar13[1]);
                }
                else {
                  if (iVar17 != 0) {
                    handle_unreachable("unexpected action",
                                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SpillPointers.cpp"
                                       ,0x8f);
                  }
                  SortedVector::insert((SortedVector *)local_68,piVar13[1]);
                }
                bVar4 = 1 < (long)uVar16;
                uVar16 = uVar16 - 1;
              } while (bVar4);
            }
            if (local_68 != (undefined1  [8])0x0) {
              operator_delete((void *)local_68,
                              (long)live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)local_68);
            }
          }
        }
      }
      puVar18 = puVar18 + 1;
    } while (puVar18 != puVar1);
    if (((ulong)local_90 & 1) != 0) {
      uVar8 = wasm::Type::getByteSize
                        ((Type *)live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
      ABI::getStackSpace((ABI *)(ulong)local_34,(Index)this_00,
                         (Function *)(ulong)(uVar8 * (int)pointerMap._M_h._M_before_begin._M_nxt),
                         (Index)(this->
                                super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                                ).
                                super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                                .
                                super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
                                .
                                super_PostWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                                .
                                super_Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                                .currModule,(Module *)in_R8.id);
    }
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_f8);
  return;
}

Assistant:

void spillPointers() {
    pointerType = getModule()->memories[0]->addressType;

    // we only care about possible pointers
    auto* func = getFunction();
    PointerMap pointerMap;
    for (Index i = 0; i < func->getNumLocals(); i++) {
      if (func->getLocalType(i) == pointerType) {
        auto offset = pointerMap.size() * pointerType.getByteSize();
        pointerMap[i] = offset;
      }
    }
    // find calls and spill around them
    bool spilled = false;
    Index spillLocal = -1;
    for (auto& curr : basicBlocks) {
      if (liveBlocks.count(curr.get()) == 0) {
        continue; // ignore dead blocks
      }
      auto& liveness = curr->contents;
      auto& actions = liveness.actions;
      Index lastCall = -1;
      for (Index i = 0; i < actions.size(); i++) {
        auto& action = liveness.actions[i];
        if (action.isOther()) {
          lastCall = i;
        }
      }
      if (lastCall == Index(-1)) {
        continue; // nothing to see here
      }
      // scan through the block, spilling around the calls
      // TODO: we can filter on pointerMap everywhere
      SetOfLocals live = liveness.end;
      for (int i = int(actions.size()) - 1; i >= 0; i--) {
        auto& action = actions[i];
        if (action.isGet()) {
          live.insert(action.index);
        } else if (action.isSet()) {
          live.erase(action.index);
        } else if (action.isOther()) {
          std::vector<Index> toSpill;
          for (auto index : live) {
            if (pointerMap.count(index) > 0) {
              toSpill.push_back(index);
            }
          }
          if (!toSpill.empty()) {
            // we now have a call + the information about which locals
            // should be spilled
            if (!spilled) {
              // prepare stack support: get a pointer to stack space big enough
              // for all our data
              spillLocal = Builder::addVar(func, pointerType);
              spilled = true;
            }
            // the origin was seen at walk, but the thing may have moved
            auto* pointer = actualPointers[action.origin];
            spillPointersAroundCall(
              pointer, toSpill, spillLocal, pointerMap, func, getModule());
          }
        } else {
          WASM_UNREACHABLE("unexpected action");
        }
      }
    }
    if (spilled) {
      // get the stack space, and set the local to it
      ABI::getStackSpace(spillLocal,
                         func,
                         pointerType.getByteSize() * pointerMap.size(),
                         *getModule());
    }
  }